

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall cmCTestVC::InitialCheckout(cmCTestVC *this,string *command)

{
  pointer *this_00;
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  size_type sVar5;
  char **cmd;
  string local_7a8 [32];
  undefined1 local_788 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_608 [7];
  bool result;
  OutputLogger err;
  OutputLogger out;
  value_type local_580;
  reference local_578;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> vc_co;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_520 [32];
  undefined1 local_500 [8];
  ostringstream cmCTestLog_msg_2;
  Status local_388;
  string local_380 [32];
  undefined1 local_360 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_1e8 [8];
  string parent;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  string *command_local;
  cmCTestVC *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = std::operator<<((ostream *)local_198,"   First perform the initial checkout: ");
  poVar3 = std::operator<<(poVar3,(string *)command);
  std::operator<<(poVar3,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0x2c,pcVar4,false);
  std::__cxx11::string::~string((string *)(parent.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_198);
  cmsys::SystemTools::GetFilenamePath((string *)local_1e8,&this->SourceDirectory);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
  poVar3 = std::operator<<((ostream *)local_360,"   Perform checkout in directory: ");
  poVar3 = std::operator<<(poVar3,(string *)local_1e8);
  std::operator<<(poVar3,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0x31,pcVar4,false);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
  local_388 = cmsys::SystemTools::MakeDirectory((string *)local_1e8,(mode_t *)0x0);
  bVar2 = cmsys::Status::operator_cast_to_bool(&local_388);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    cmSystemTools::ParseArguments
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,command);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,sVar5 + 1);
    this_00 = &vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00);
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arg);
      if (!bVar2) break;
      local_578 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      local_580 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,&local_580);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    out.super_LineParser.Separator = '\0';
    out.super_LineParser.LineEnd = '\0';
    out.super_LineParser.IgnoreCR = false;
    out.super_LineParser._59_5_ = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,
               (value_type *)&out.super_LineParser.Separator);
    std::operator<<(this->Log,"--- Begin Initial Checkout ---\n");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)&err.super_LineParser.Separator,this->Log,"co-out> ");
    cmProcessTools::OutputLogger::OutputLogger((OutputLogger *)local_608,this->Log,"co-err> ");
    cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ =
         RunChild(this,cmd,(OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_608
                  ,pcVar4,Auto);
    std::operator<<(this->Log,"--- End Initial Checkout ---\n");
    if (!this_local._7_1_) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
      poVar3 = std::operator<<((ostream *)local_788,"Initial checkout failed!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestVC.cxx"
                   ,0x49,pcVar4,false);
      std::__cxx11::string::~string(local_7a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
    }
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_608);
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&err.super_LineParser.Separator);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
    poVar3 = std::operator<<((ostream *)local_500,"Cannot create directory: ");
    poVar3 = std::operator<<(poVar3,(string *)local_1e8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestVC.cxx"
                 ,0x34,pcVar4,false);
    std::__cxx11::string::~string(local_520);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_1e8);
  return this_local._7_1_;
}

Assistant:

bool cmCTestVC::InitialCheckout(const std::string& command)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   First perform the initial checkout: " << command << "\n");

  // Make the parent directory in which to perform the checkout.
  std::string parent = cmSystemTools::GetFilenamePath(this->SourceDirectory);
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Perform checkout in directory: " << parent << "\n");
  if (!cmSystemTools::MakeDirectory(parent)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create directory: " << parent << std::endl);
    return false;
  }

  // Construct the initial checkout command line.
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);
  std::vector<char const*> vc_co;
  vc_co.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    vc_co.push_back(arg.c_str());
  }
  vc_co.push_back(nullptr);

  // Run the initial checkout command and log its output.
  this->Log << "--- Begin Initial Checkout ---\n";
  OutputLogger out(this->Log, "co-out> ");
  OutputLogger err(this->Log, "co-err> ");
  bool result = this->RunChild(vc_co.data(), &out, &err, parent.c_str());
  this->Log << "--- End Initial Checkout ---\n";
  if (!result) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Initial checkout failed!" << std::endl);
  }
  return result;
}